

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStorage.cpp
# Opt level: O1

void __thiscall OpenMD::DataStorage::resize(DataStorage *this,size_t newSize)

{
  if ((this->storageLayout_ & 1) != 0) {
    internalResize<OpenMD::Vector3<double>>(this,&this->position,newSize);
  }
  if ((this->storageLayout_ & 2) != 0) {
    internalResize<OpenMD::Vector3<double>>(this,&this->velocity,newSize);
  }
  if ((this->storageLayout_ & 4) != 0) {
    internalResize<OpenMD::Vector3<double>>(this,&this->force,newSize);
  }
  if ((this->storageLayout_ & 8) != 0) {
    internalResize<OpenMD::SquareMatrix3<double>>(this,&this->aMat,newSize);
  }
  if ((this->storageLayout_ & 0x10) != 0) {
    internalResize<OpenMD::Vector3<double>>(this,&this->angularMomentum,newSize);
  }
  if ((this->storageLayout_ & 0x20) != 0) {
    internalResize<OpenMD::Vector3<double>>(this,&this->torque,newSize);
  }
  if ((this->storageLayout_ & 0x40) != 0) {
    internalResize<double>(this,&this->particlePot,newSize);
  }
  if ((this->storageLayout_ & 0x80) != 0) {
    internalResize<double>(this,&this->density,newSize);
  }
  if ((this->storageLayout_ & 0x100) != 0) {
    internalResize<double>(this,&this->functional,newSize);
  }
  if ((this->storageLayout_ & 0x200) != 0) {
    internalResize<double>(this,&this->functionalDerivative,newSize);
  }
  if ((this->storageLayout_ & 0x400) != 0) {
    internalResize<OpenMD::Vector3<double>>(this,&this->dipole,newSize);
  }
  if ((this->storageLayout_ & 0x800) != 0) {
    internalResize<OpenMD::SquareMatrix3<double>>(this,&this->quadrupole,newSize);
  }
  if ((this->storageLayout_ & 0x1000) != 0) {
    internalResize<OpenMD::Vector3<double>>(this,&this->electricField,newSize);
  }
  if ((this->storageLayout_ & 0x2000) != 0) {
    internalResize<double>(this,&this->skippedCharge,newSize);
  }
  if ((this->storageLayout_ & 0x4000) != 0) {
    internalResize<double>(this,&this->flucQPos,newSize);
  }
  if ((this->storageLayout_ & 0x8000) != 0) {
    internalResize<double>(this,&this->flucQVel,newSize);
  }
  if ((this->storageLayout_ & 0x10000) != 0) {
    internalResize<double>(this,&this->flucQFrc,newSize);
  }
  if ((this->storageLayout_ & 0x20000) != 0) {
    internalResize<double>(this,&this->sitePotential,newSize);
  }
  this->size_ = newSize;
  return;
}

Assistant:

void DataStorage::resize(std::size_t newSize) {
    if (storageLayout_ & dslPosition) { internalResize(position, newSize); }

    if (storageLayout_ & dslVelocity) { internalResize(velocity, newSize); }

    if (storageLayout_ & dslForce) { internalResize(force, newSize); }

    if (storageLayout_ & dslAmat) { internalResize(aMat, newSize); }

    if (storageLayout_ & dslAngularMomentum) {
      internalResize(angularMomentum, newSize);
    }

    if (storageLayout_ & dslTorque) { internalResize(torque, newSize); }

    if (storageLayout_ & dslParticlePot) {
      internalResize(particlePot, newSize);
    }

    if (storageLayout_ & dslDensity) { internalResize(density, newSize); }

    if (storageLayout_ & dslFunctional) { internalResize(functional, newSize); }

    if (storageLayout_ & dslFunctionalDerivative) {
      internalResize(functionalDerivative, newSize);
    }

    if (storageLayout_ & dslDipole) { internalResize(dipole, newSize); }

    if (storageLayout_ & dslQuadrupole) { internalResize(quadrupole, newSize); }

    if (storageLayout_ & dslElectricField) {
      internalResize(electricField, newSize);
    }

    if (storageLayout_ & dslSkippedCharge) {
      internalResize(skippedCharge, newSize);
    }

    if (storageLayout_ & dslFlucQPosition) {
      internalResize(flucQPos, newSize);
    }

    if (storageLayout_ & dslFlucQVelocity) {
      internalResize(flucQVel, newSize);
    }

    if (storageLayout_ & dslFlucQForce) { internalResize(flucQFrc, newSize); }

    if (storageLayout_ & dslSitePotential) {
      internalResize(sitePotential, newSize);
    }

    size_ = newSize;
  }